

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O1

void __thiscall
Hospital::Read_From_File_And_Create_Objects<Nurse>
          (Hospital *this,vector<Nurse,_std::allocator<Nurse>_> *All_Of_Humans,fstream *inFile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  long *plVar5;
  string password;
  string password_00;
  string password_01;
  string age;
  string age_00;
  string age_01;
  string field;
  string field_00;
  string field_01;
  string day;
  string day_00;
  string day_01;
  string time;
  string time_00;
  string time_01;
  string dammy;
  string dammy_00;
  string dammy_01;
  pointer pbVar6;
  pointer pbVar7;
  long lVar8;
  ostream *poVar9;
  int iVar10;
  pointer pbVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  long *in_stack_fffffffffffffa18;
  undefined8 in_stack_fffffffffffffa20;
  long local_5d8;
  undefined8 uStack_5d0;
  string s;
  long *local_5a8;
  undefined8 uStack_5a0;
  long local_598 [2];
  long *local_588 [2];
  long local_578 [2];
  long *local_568 [2];
  long local_558 [2];
  long *local_548 [2];
  long local_538 [2];
  long *local_528 [2];
  long local_518 [2];
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  long *local_488 [2];
  long local_478 [2];
  long *local_468 [2];
  long local_458 [2];
  long *local_448 [2];
  long local_438 [2];
  long *local_428 [2];
  long local_418 [2];
  long *local_408 [2];
  long local_3f8 [2];
  string local_3e8;
  string local_3c8;
  string local_3a8;
  long *local_388 [2];
  long local_378 [2];
  long *local_368 [2];
  long local_358 [2];
  long *local_348 [2];
  long local_338 [2];
  long *local_328 [2];
  long local_318 [2];
  long *local_308 [2];
  long local_2f8 [2];
  string local_2e8;
  string local_2c8;
  string local_2a8;
  long *local_288 [2];
  long local_278 [2];
  string local_268;
  long *local_248 [2];
  long local_238 [2];
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string item;
  Nurse New_Nurse;
  
  if (((byte)inFile[*(long *)(*(long *)inFile + -0x18) + 0x20] & 5) != 0) {
    poVar9 = std::operator<<((ostream *)&std::cerr,"Error opening file !!! ");
    std::endl<char,std::char_traits<char>>(poVar9);
    exit(1);
  }
  item._M_dataplus._M_p = (pointer)&item.field_2;
  item._M_string_length = 0;
  item.field_2._M_local_buf[0] = '\0';
  temp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  temp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  temp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  s._M_dataplus._M_p = (pointer)&s.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&s,"5Nurse","");
  if (((byte)inFile[*(long *)(*(long *)inFile + -0x18) + 0x20] & 2) == 0) {
    this_00 = &New_Nurse.nurse_all_ino;
    paVar1 = &New_Nurse.Field.field_2;
    paVar2 = &New_Nurse.Time.field_2;
    paVar3 = &New_Nurse.Day.field_2;
    iVar10 = 0;
    do {
      std::operator>>((istream *)inFile,(string *)&item);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&temp,&item);
      lVar8 = std::__cxx11::string::find((char *)&s,0x12a87d,0);
      if (iVar10 == 9 && lVar8 != -1) {
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        pcVar4 = ((temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c8,pcVar4,
                   pcVar4 + (temp.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        pcVar4 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,pcVar4,
                   pcVar4 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        pcVar4 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2a8,pcVar4,
                   pcVar4 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
        local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
        pcVar4 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c8,pcVar4,
                   pcVar4 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[3]._M_string_length);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        pcVar4 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e8,pcVar4,
                   pcVar4 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[4]._M_string_length);
        local_308[0] = local_2f8;
        pcVar4 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[5]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_308,pcVar4,
                   pcVar4 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[5]._M_string_length);
        local_328[0] = local_318;
        pcVar4 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[6]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_328,pcVar4,
                   pcVar4 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[6]._M_string_length);
        local_348[0] = local_338;
        pcVar4 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[7]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_348,pcVar4,
                   pcVar4 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[7]._M_string_length);
        local_368[0] = local_358;
        pcVar4 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[8]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,pcVar4,
                   pcVar4 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[8]._M_string_length);
        local_388[0] = local_378;
        pcVar4 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[9]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_388,pcVar4,
                   pcVar4 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[9]._M_string_length);
        in_stack_fffffffffffffa18 = &local_5d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffa18,"salam","");
        password._M_string_length = (size_type)local_328;
        password._M_dataplus._M_p = (pointer)local_308;
        password.field_2._M_allocated_capacity = (size_type)local_348;
        password.field_2._8_8_ = local_368;
        age._M_string_length = (size_type)&stack0xfffffffffffffa18;
        age._M_dataplus._M_p = (pointer)local_388;
        age.field_2._M_allocated_capacity =
             (size_type)
             temp.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        age.field_2._8_8_ =
             temp.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        field._M_string_length = (size_type)paVar3;
        field._M_dataplus._M_p =
             (pointer)temp.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        field.field_2._M_allocated_capacity = (size_type)paVar2;
        field.field_2._8_8_ = paVar1;
        day._M_string_length = (size_type)All_Of_Humans;
        day._M_dataplus._M_p = (pointer)this_00;
        day.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffa18;
        day.field_2._8_8_ = in_stack_fffffffffffffa20;
        time._M_string_length = uStack_5d0;
        time._M_dataplus._M_p = (pointer)local_5d8;
        time.field_2._M_allocated_capacity = (size_type)s._M_dataplus._M_p;
        time.field_2._8_8_ = s._M_string_length;
        dammy._M_string_length = s.field_2._8_8_;
        dammy._M_dataplus._M_p = (pointer)s.field_2._M_allocated_capacity;
        dammy.field_2._M_allocated_capacity = (size_type)local_5a8;
        dammy.field_2._8_8_ = uStack_5a0;
        Nurse::Nurse(&New_Nurse,&local_1c8,&local_1e8,&local_2a8,&local_2c8,&local_2e8,password,age,
                     field,day,time,dammy);
        if (in_stack_fffffffffffffa18 != &local_5d8) {
          operator_delete(in_stack_fffffffffffffa18,local_5d8 + 1);
        }
        if (local_388[0] != local_378) {
          operator_delete(local_388[0],local_378[0] + 1);
        }
        if (local_368[0] != local_358) {
          operator_delete(local_368[0],local_358[0] + 1);
        }
        if (local_348[0] != local_338) {
          operator_delete(local_348[0],local_338[0] + 1);
        }
        if (local_328[0] != local_318) {
          operator_delete(local_328[0],local_318[0] + 1);
        }
        if (local_308[0] != local_2f8) {
          operator_delete(local_308[0],local_2f8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        std::vector<Nurse,_std::allocator<Nurse>_>::push_back(All_Of_Humans,&New_Nurse);
        pbVar7 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar6 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (temp.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            temp.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          paVar12 = &(temp.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_2;
          do {
            plVar5 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (paVar12 + -1))->_M_dataplus)._M_p;
            if (paVar12 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar5) {
              operator_delete(plVar5,paVar12->_M_allocated_capacity + 1);
            }
            pbVar11 = (pointer)(paVar12 + 1);
            paVar12 = paVar12 + 2;
          } while (pbVar11 != pbVar7);
          temp.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar6;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(this_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)New_Nurse.Field._M_dataplus._M_p != paVar1) {
          operator_delete(New_Nurse.Field._M_dataplus._M_p,
                          New_Nurse.Field.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)New_Nurse.Time._M_dataplus._M_p != paVar2) {
          operator_delete(New_Nurse.Time._M_dataplus._M_p,
                          New_Nurse.Time.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)New_Nurse.Day._M_dataplus._M_p != paVar3) {
          operator_delete(New_Nurse.Day._M_dataplus._M_p,
                          New_Nurse.Day.field_2._M_allocated_capacity + 1);
        }
LAB_00123712:
        Human::~Human(&New_Nurse.super_Human);
        iVar10 = -1;
      }
      else {
        lVar8 = std::__cxx11::string::find((char *)&s,0x12a889,0);
        if (iVar10 == 10 && lVar8 != -1) {
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          pcVar4 = ((temp.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_208,pcVar4,
                     pcVar4 + (temp.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          pcVar4 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_228,pcVar4,
                     pcVar4 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
          local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
          pcVar4 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3a8,pcVar4,
                     pcVar4 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
          local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
          pcVar4 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3c8,pcVar4,
                     pcVar4 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[3]._M_string_length);
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          pcVar4 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3e8,pcVar4,
                     pcVar4 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[4]._M_string_length);
          local_408[0] = local_3f8;
          pcVar4 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[5]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_408,pcVar4,
                     pcVar4 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[5]._M_string_length);
          local_428[0] = local_418;
          pcVar4 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[6]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_428,pcVar4,
                     pcVar4 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[6]._M_string_length);
          local_448[0] = local_438;
          pcVar4 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[7]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_448,pcVar4,
                     pcVar4 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[7]._M_string_length);
          local_468[0] = local_458;
          pcVar4 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[8]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_468,pcVar4,
                     pcVar4 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[8]._M_string_length);
          local_488[0] = local_478;
          pcVar4 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[9]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_488,pcVar4,
                     pcVar4 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[9]._M_string_length);
          local_248[0] = local_238;
          pcVar4 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[10]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_248,pcVar4,
                     pcVar4 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[10]._M_string_length);
          password_00._M_string_length = (size_type)local_428;
          password_00._M_dataplus._M_p = (pointer)local_408;
          password_00.field_2._M_allocated_capacity = (size_type)local_448;
          password_00.field_2._8_8_ = local_468;
          age_00._M_string_length = (size_type)local_248;
          age_00._M_dataplus._M_p = (pointer)local_488;
          age_00.field_2._M_allocated_capacity =
               (size_type)
               temp.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          age_00.field_2._8_8_ =
               temp.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          field_00._M_string_length = (size_type)paVar3;
          field_00._M_dataplus._M_p =
               (pointer)temp.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          field_00.field_2._M_allocated_capacity = (size_type)paVar2;
          field_00.field_2._8_8_ = paVar1;
          day_00._M_string_length = (size_type)All_Of_Humans;
          day_00._M_dataplus._M_p = (pointer)this_00;
          day_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffa18;
          day_00.field_2._8_8_ = in_stack_fffffffffffffa20;
          time_00._M_string_length = uStack_5d0;
          time_00._M_dataplus._M_p = (pointer)local_5d8;
          time_00.field_2._M_allocated_capacity = (size_type)s._M_dataplus._M_p;
          time_00.field_2._8_8_ = s._M_string_length;
          dammy_00._M_string_length = s.field_2._8_8_;
          dammy_00._M_dataplus._M_p = (pointer)s.field_2._M_allocated_capacity;
          dammy_00.field_2._M_allocated_capacity = (size_type)local_5a8;
          dammy_00.field_2._8_8_ = uStack_5a0;
          Nurse::Nurse(&New_Nurse,&local_208,&local_228,&local_3a8,&local_3c8,&local_3e8,password_00
                       ,age_00,field_00,day_00,time_00,dammy_00);
          if (local_248[0] != local_238) {
            operator_delete(local_248[0],local_238[0] + 1);
          }
          if (local_488[0] != local_478) {
            operator_delete(local_488[0],local_478[0] + 1);
          }
          if (local_468[0] != local_458) {
            operator_delete(local_468[0],local_458[0] + 1);
          }
          if (local_448[0] != local_438) {
            operator_delete(local_448[0],local_438[0] + 1);
          }
          if (local_428[0] != local_418) {
            operator_delete(local_428[0],local_418[0] + 1);
          }
          if (local_408[0] != local_3f8) {
            operator_delete(local_408[0],local_3f8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          std::vector<Nurse,_std::allocator<Nurse>_>::push_back(All_Of_Humans,&New_Nurse);
          pbVar7 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar6 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (temp.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              temp.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar12 = &(temp.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar5 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar12 + -1))->_M_dataplus)._M_p;
              if (paVar12 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar5) {
                operator_delete(plVar5,paVar12->_M_allocated_capacity + 1);
              }
              pbVar11 = (pointer)(paVar12 + 1);
              paVar12 = paVar12 + 2;
            } while (pbVar11 != pbVar7);
            temp.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar6;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(this_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)New_Nurse.Field._M_dataplus._M_p != paVar1) {
            operator_delete(New_Nurse.Field._M_dataplus._M_p,
                            New_Nurse.Field.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)New_Nurse.Time._M_dataplus._M_p != paVar2) {
            operator_delete(New_Nurse.Time._M_dataplus._M_p,
                            New_Nurse.Time.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)New_Nurse.Day._M_dataplus._M_p != paVar3) {
            operator_delete(New_Nurse.Day._M_dataplus._M_p,
                            New_Nurse.Day.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00123712;
        }
        lVar8 = std::__cxx11::string::find((char *)&s,0x12a890,0);
        if (iVar10 == 7 && lVar8 != -1) {
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          pcVar4 = ((temp.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_268,pcVar4,
                     pcVar4 + (temp.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
          local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
          pcVar4 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4a8,pcVar4,
                     pcVar4 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
          local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
          pcVar4 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4c8,pcVar4,
                     pcVar4 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
          local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
          pcVar4 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4e8,pcVar4,
                     pcVar4 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[3]._M_string_length);
          local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
          pcVar4 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_508,pcVar4,
                     pcVar4 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[4]._M_string_length);
          local_528[0] = local_518;
          pcVar4 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[5]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_528,pcVar4,
                     pcVar4 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[5]._M_string_length);
          local_548[0] = local_538;
          pcVar4 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[6]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_548,pcVar4,
                     pcVar4 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[6]._M_string_length);
          local_568[0] = local_558;
          pcVar4 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[7]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_568,pcVar4,
                     pcVar4 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[7]._M_string_length);
          local_588[0] = local_578;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"salam1","");
          local_5a8 = local_598;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"salam1","");
          local_288[0] = local_278;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"salam2","");
          password_01._M_string_length = (size_type)local_548;
          password_01._M_dataplus._M_p = (pointer)local_528;
          password_01.field_2._M_allocated_capacity = (size_type)local_568;
          password_01.field_2._8_8_ = local_588;
          age_01._M_string_length = (size_type)local_288;
          age_01._M_dataplus._M_p = (pointer)&local_5a8;
          age_01.field_2._M_allocated_capacity =
               (size_type)
               temp.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          age_01.field_2._8_8_ =
               temp.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          field_01._M_string_length = (size_type)paVar3;
          field_01._M_dataplus._M_p =
               (pointer)temp.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          field_01.field_2._M_allocated_capacity = (size_type)paVar2;
          field_01.field_2._8_8_ = paVar1;
          day_01._M_string_length = (size_type)All_Of_Humans;
          day_01._M_dataplus._M_p = (pointer)this_00;
          day_01.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffa18;
          day_01.field_2._8_8_ = in_stack_fffffffffffffa20;
          time_01._M_string_length = uStack_5d0;
          time_01._M_dataplus._M_p = (pointer)local_5d8;
          time_01.field_2._M_allocated_capacity = (size_type)s._M_dataplus._M_p;
          time_01.field_2._8_8_ = s._M_string_length;
          dammy_01._M_string_length = s.field_2._8_8_;
          dammy_01._M_dataplus._M_p = (pointer)s.field_2._M_allocated_capacity;
          dammy_01.field_2._M_allocated_capacity = (size_type)local_5a8;
          dammy_01.field_2._8_8_ = uStack_5a0;
          Nurse::Nurse(&New_Nurse,&local_268,&local_4a8,&local_4c8,&local_4e8,&local_508,password_01
                       ,age_01,field_01,day_01,time_01,dammy_01);
          if (local_288[0] != local_278) {
            operator_delete(local_288[0],local_278[0] + 1);
          }
          if (local_5a8 != local_598) {
            operator_delete(local_5a8,local_598[0] + 1);
          }
          if (local_588[0] != local_578) {
            operator_delete(local_588[0],local_578[0] + 1);
          }
          if (local_568[0] != local_558) {
            operator_delete(local_568[0],local_558[0] + 1);
          }
          if (local_548[0] != local_538) {
            operator_delete(local_548[0],local_538[0] + 1);
          }
          if (local_528[0] != local_518) {
            operator_delete(local_528[0],local_518[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_508._M_dataplus._M_p != &local_508.field_2) {
            operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
            operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
            operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
            operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          std::vector<Nurse,_std::allocator<Nurse>_>::push_back(All_Of_Humans,&New_Nurse);
          pbVar7 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar6 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (temp.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              temp.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar12 = &(temp.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar5 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar12 + -1))->_M_dataplus)._M_p;
              if (paVar12 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar5) {
                operator_delete(plVar5,paVar12->_M_allocated_capacity + 1);
              }
              pbVar11 = (pointer)(paVar12 + 1);
              paVar12 = paVar12 + 2;
            } while (pbVar11 != pbVar7);
            temp.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar6;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(this_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)New_Nurse.Field._M_dataplus._M_p != paVar1) {
            operator_delete(New_Nurse.Field._M_dataplus._M_p,
                            New_Nurse.Field.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)New_Nurse.Time._M_dataplus._M_p != paVar2) {
            operator_delete(New_Nurse.Time._M_dataplus._M_p,
                            New_Nurse.Time.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)New_Nurse.Day._M_dataplus._M_p != paVar3) {
            operator_delete(New_Nurse.Day._M_dataplus._M_p,
                            New_Nurse.Day.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00123712;
        }
      }
      iVar10 = iVar10 + 1;
    } while (((byte)inFile[*(long *)(*(long *)inFile + -0x18) + 0x20] & 2) == 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)s._M_dataplus._M_p != &s.field_2) {
    operator_delete(s._M_dataplus._M_p,s.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&temp);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)item._M_dataplus._M_p != &item.field_2) {
    operator_delete(item._M_dataplus._M_p,
                    CONCAT71(item.field_2._M_allocated_capacity._1_7_,item.field_2._M_local_buf[0])
                    + 1);
  }
  return;
}

Assistant:

void Hospital::Read_From_File_And_Create_Objects (vector<T>& All_Of_Humans , fstream& inFile){

    if (inFile.fail()){
        cerr << "Error opening file !!! " <<endl;
        exit(1) ;
    }

    int counter = 0 ;
    string item;
    vector<string>temp;
    string s=typeid(T).name();
    while(!inFile.eof()){

        inFile >> item ;
        temp.push_back(item);
        if(s.find("Nurse")!=string::npos && counter == 9){

            T New_Nurse(temp[0], temp[1], temp[2], temp[3], temp[4], temp[5], temp[6], temp[7], temp[8],
                        temp[9] ,"salam");
            All_Of_Humans.push_back(New_Nurse);
            temp.clear();
            counter = -1;

        }
        else if(s.find("Doctor")!=string::npos  && counter == 10) {

            T New_Doctor(temp[0], temp[1], temp[2], temp[3], temp[4], temp[5], temp[6], temp[7], temp[8],
                         temp[9], temp[10] );

            All_Of_Humans.push_back(New_Doctor);
            temp.clear();
            counter =-1;

        }
        else if (s.find("Patient")!=string::npos  && counter == 7) {

            T New_Patient(temp[0], temp[1], temp[2], temp[3], temp[4], temp[5], temp[6], temp[7],"salam1","salam1","salam2"
            );
            All_Of_Humans.push_back(New_Patient);
            temp.clear();
            counter = -1;
        }

        counter++;

    }
}